

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::Buffer::BindBase(Buffer *this,GLuint index)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x48))(this->m_target,index,this->m_id);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"BindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x142);
  return;
}

Assistant:

void Buffer::BindBase(glw::GLuint index) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	BindBase(gl, m_id, m_target, index);
}